

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer_sequence_adapter.hpp
# Opt level: O2

void __thiscall
asio::detail::
buffer_sequence_adapter<asio::const_buffer,asio::detail::prepared_buffers<asio::const_buffer,64ul>>
::init<asio::const_buffer_const*>
          (buffer_sequence_adapter<asio::const_buffer,asio::detail::prepared_buffers<asio::const_buffer,64ul>>
           *this,const_buffer *begin,const_buffer *end)

{
  size_t sVar1;
  ulong uVar2;
  long lVar3;
  buffer_sequence_adapter<asio::const_buffer,asio::detail::prepared_buffers<asio::const_buffer,64ul>>
  *pbVar4;
  
  uVar2 = *(ulong *)(this + 0x400);
  lVar3 = *(long *)(this + 0x408);
  pbVar4 = this + uVar2 * 0x10 + 8;
  while ((begin != end && (uVar2 < 0x40))) {
    sVar1 = begin->size_;
    *(void **)(pbVar4 + -8) = begin->data_;
    *(size_t *)pbVar4 = sVar1;
    lVar3 = lVar3 + sVar1;
    *(long *)(this + 0x408) = lVar3;
    begin = begin + 1;
    uVar2 = uVar2 + 1;
    *(ulong *)(this + 0x400) = uVar2;
    pbVar4 = pbVar4 + 0x10;
  }
  return;
}

Assistant:

void init(Iterator begin, Iterator end)
  {
    Iterator iter = begin;
    for (; iter != end && count_ < max_buffers; ++iter, ++count_)
    {
      Buffer buffer(*iter);
      init_native_buffer(buffers_[count_], buffer);
      total_buffer_size_ += buffer.size();
    }
  }